

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

void __thiscall
soplex::SVSetBase<double>::updateUnusedMemEstimation(SVSetBase<double> *this,int change)

{
  int iVar1;
  int iVar2;
  DLPSV *pDVar3;
  int iVar4;
  
  iVar2 = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
  iVar1 = this->numUnusedMemUpdates;
  iVar4 = change + this->unusedMem;
  this->unusedMem = iVar4;
  this->numUnusedMemUpdates = iVar1 + 1;
  if ((iVar4 < 0) || (0xf423e < iVar1 || iVar2 < iVar4)) {
    this->unusedMem = iVar2;
    pDVar3 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first;
    if (pDVar3 != (DLPSV *)0x0) {
      do {
        iVar2 = iVar2 - (pDVar3->super_SVectorBase<double>).memused;
        if ((this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last == pDVar3) break;
        pDVar3 = pDVar3->thenext;
      } while (pDVar3 != (DLPSV *)0x0);
      this->unusedMem = iVar2;
    }
    this->numUnusedMemUpdates = 0;
  }
  return;
}

Assistant:

void updateUnusedMemEstimation(int change)
   {
      unusedMem += change;
      numUnusedMemUpdates++;

      if(unusedMem < 0 || unusedMem > memSize() || numUnusedMemUpdates >= 1000000)
         countUnusedMem();
   }